

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O3

void pffft_cplx_preprocess(int Ncvec,v4sf *in,v4sf *out,v4sf *e)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  int iVar25;
  v4sf *pafVar26;
  long lVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  
  iVar25 = Ncvec + 3;
  if (-1 < Ncvec) {
    iVar25 = Ncvec;
  }
  if (in != out) {
    if (3 < Ncvec) {
      pafVar26 = e + 5;
      lVar27 = 0;
      do {
        pfVar1 = (float *)((long)*in + lVar27);
        pfVar2 = (float *)((long)in[1] + lVar27);
        pfVar3 = (float *)((long)in[2] + lVar27);
        pfVar4 = (float *)((long)in[3] + lVar27);
        pfVar5 = (float *)((long)in[4] + lVar27);
        pfVar6 = (float *)((long)in[5] + lVar27);
        pfVar7 = (float *)((long)in[6] + lVar27);
        pfVar8 = (float *)((long)in[7] + lVar27);
        fVar56 = *pfVar1 + *pfVar5;
        fVar58 = pfVar1[1] + pfVar5[1];
        fVar60 = pfVar1[2] + pfVar5[2];
        fVar62 = pfVar1[3] + pfVar5[3];
        fVar40 = *pfVar1 - *pfVar5;
        fVar41 = pfVar1[1] - pfVar5[1];
        fVar42 = pfVar1[2] - pfVar5[2];
        fVar43 = pfVar1[3] - pfVar5[3];
        fVar68 = *pfVar3 + *pfVar7;
        fVar69 = pfVar3[1] + pfVar7[1];
        fVar70 = pfVar3[2] + pfVar7[2];
        fVar71 = pfVar3[3] + pfVar7[3];
        fVar64 = *pfVar3 - *pfVar7;
        fVar65 = pfVar3[1] - pfVar7[1];
        fVar66 = pfVar3[2] - pfVar7[2];
        fVar67 = pfVar3[3] - pfVar7[3];
        fVar28 = *pfVar2 + *pfVar6;
        fVar30 = pfVar2[1] + pfVar6[1];
        fVar32 = pfVar2[2] + pfVar6[2];
        fVar34 = pfVar2[3] + pfVar6[3];
        fVar36 = *pfVar2 - *pfVar6;
        fVar37 = pfVar2[1] - pfVar6[1];
        fVar38 = pfVar2[2] - pfVar6[2];
        fVar39 = pfVar2[3] - pfVar6[3];
        fVar72 = *pfVar4 + *pfVar8;
        fVar73 = pfVar4[1] + pfVar8[1];
        fVar74 = pfVar4[2] + pfVar8[2];
        fVar75 = pfVar4[3] + pfVar8[3];
        fVar44 = *pfVar4 - *pfVar8;
        fVar45 = pfVar4[1] - pfVar8[1];
        fVar46 = pfVar4[2] - pfVar8[2];
        fVar47 = pfVar4[3] - pfVar8[3];
        fVar52 = fVar40 - fVar44;
        fVar53 = fVar41 - fVar45;
        fVar54 = fVar42 - fVar46;
        fVar55 = fVar43 - fVar47;
        fVar48 = fVar36 + fVar64;
        fVar49 = fVar37 + fVar65;
        fVar50 = fVar38 + fVar66;
        fVar51 = fVar39 + fVar67;
        fVar57 = fVar56 - fVar68;
        fVar59 = fVar58 - fVar69;
        fVar61 = fVar60 - fVar70;
        fVar63 = fVar62 - fVar71;
        fVar29 = fVar28 - fVar72;
        fVar31 = fVar30 - fVar73;
        fVar33 = fVar32 - fVar74;
        fVar35 = fVar34 - fVar75;
        fVar44 = fVar44 + fVar40;
        fVar45 = fVar45 + fVar41;
        fVar46 = fVar46 + fVar42;
        fVar47 = fVar47 + fVar43;
        fVar36 = fVar36 - fVar64;
        fVar37 = fVar37 - fVar65;
        fVar38 = fVar38 - fVar66;
        fVar39 = fVar39 - fVar67;
        fVar40 = pafVar26[-5][0];
        fVar41 = pafVar26[-5][1];
        fVar42 = pafVar26[-5][2];
        fVar43 = pafVar26[-5][3];
        fVar64 = pafVar26[-4][0];
        fVar65 = pafVar26[-4][1];
        fVar66 = pafVar26[-4][2];
        fVar67 = pafVar26[-4][3];
        fVar9 = pafVar26[-3][0];
        fVar10 = pafVar26[-3][1];
        fVar11 = pafVar26[-3][2];
        fVar12 = pafVar26[-3][3];
        fVar13 = pafVar26[-2][0];
        fVar14 = pafVar26[-2][1];
        fVar15 = pafVar26[-2][2];
        fVar16 = pafVar26[-2][3];
        fVar17 = (*pafVar26)[0];
        fVar18 = (*pafVar26)[1];
        fVar19 = (*pafVar26)[2];
        fVar20 = (*pafVar26)[3];
        fVar21 = pafVar26[-1][0];
        fVar22 = pafVar26[-1][1];
        fVar23 = pafVar26[-1][2];
        fVar24 = pafVar26[-1][3];
        pfVar1 = (float *)((long)*out + lVar27);
        *pfVar1 = fVar56 + fVar68;
        pfVar1[1] = fVar52 * fVar40 + fVar48 * fVar64;
        pfVar1[2] = fVar13 * fVar29 + fVar57 * fVar9;
        pfVar1[3] = fVar17 * fVar36 + fVar44 * fVar21;
        pfVar1 = (float *)((long)out[1] + lVar27);
        *pfVar1 = fVar28 + fVar72;
        pfVar1[1] = fVar48 * fVar40 - fVar64 * fVar52;
        pfVar1[2] = fVar29 * fVar9 - fVar57 * fVar13;
        pfVar1[3] = fVar36 * fVar21 - fVar44 * fVar17;
        pfVar1 = (float *)((long)out[2] + lVar27);
        *pfVar1 = fVar58 + fVar69;
        pfVar1[1] = fVar53 * fVar41 + fVar49 * fVar65;
        pfVar1[2] = fVar14 * fVar31 + fVar59 * fVar10;
        pfVar1[3] = fVar18 * fVar37 + fVar45 * fVar22;
        pfVar1 = (float *)((long)out[3] + lVar27);
        *pfVar1 = fVar30 + fVar73;
        pfVar1[1] = fVar49 * fVar41 - fVar65 * fVar53;
        pfVar1[2] = fVar31 * fVar10 - fVar59 * fVar14;
        pfVar1[3] = fVar37 * fVar22 - fVar45 * fVar18;
        pfVar1 = (float *)((long)out[4] + lVar27);
        *pfVar1 = fVar60 + fVar70;
        pfVar1[1] = fVar54 * fVar42 + fVar50 * fVar66;
        pfVar1[2] = fVar15 * fVar33 + fVar61 * fVar11;
        pfVar1[3] = fVar19 * fVar38 + fVar46 * fVar23;
        pfVar1 = (float *)((long)out[5] + lVar27);
        *pfVar1 = fVar32 + fVar74;
        pfVar1[1] = fVar50 * fVar42 - fVar66 * fVar54;
        pfVar1[2] = fVar33 * fVar11 - fVar61 * fVar15;
        pfVar1[3] = fVar38 * fVar23 - fVar46 * fVar19;
        pfVar1 = (float *)((long)out[6] + lVar27);
        *pfVar1 = fVar62 + fVar71;
        pfVar1[1] = fVar55 * fVar43 + fVar51 * fVar67;
        pfVar1[2] = fVar16 * fVar35 + fVar63 * fVar12;
        pfVar1[3] = fVar20 * fVar39 + fVar47 * fVar24;
        pfVar1 = (float *)((long)out[7] + lVar27);
        *pfVar1 = fVar34 + fVar75;
        pfVar1[1] = fVar51 * fVar43 - fVar67 * fVar55;
        pfVar1[2] = fVar35 * fVar12 - fVar63 * fVar16;
        pfVar1[3] = fVar39 * fVar24 - fVar47 * fVar20;
        pafVar26 = pafVar26 + 6;
        lVar27 = lVar27 + 0x80;
      } while ((ulong)(uint)(iVar25 >> 2) << 7 != lVar27);
    }
    return;
  }
  __assert_fail("in != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x56b,"void pffft_cplx_preprocess(int, const v4sf *, v4sf *, const v4sf *)");
}

Assistant:

void pffft_cplx_preprocess(int Ncvec, const v4sf *in, v4sf *out, const v4sf *e) {
  int k, dk = Ncvec/SIMD_SZ; // number of 4x4 matrix blocks
  v4sf r0, i0, r1, i1, r2, i2, r3, i3;
  v4sf sr0, dr0, sr1, dr1, si0, di0, si1, di1;
  assert(in != out);
  for (k=0; k < dk; ++k) {    
    r0 = in[8*k+0]; i0 = in[8*k+1];
    r1 = in[8*k+2]; i1 = in[8*k+3];
    r2 = in[8*k+4]; i2 = in[8*k+5];
    r3 = in[8*k+6]; i3 = in[8*k+7];

    sr0 = VADD(r0,r2); dr0 = VSUB(r0, r2);
    sr1 = VADD(r1,r3); dr1 = VSUB(r1, r3);
    si0 = VADD(i0,i2); di0 = VSUB(i0, i2);
    si1 = VADD(i1,i3); di1 = VSUB(i1, i3);

    r0 = VADD(sr0, sr1); i0 = VADD(si0, si1);
    r1 = VSUB(dr0, di1); i1 = VADD(di0, dr1);
    r2 = VSUB(sr0, sr1); i2 = VSUB(si0, si1);
    r3 = VADD(dr0, di1); i3 = VSUB(di0, dr1);

    VCPLXMULCONJ(r1,i1,e[k*6+0],e[k*6+1]);
    VCPLXMULCONJ(r2,i2,e[k*6+2],e[k*6+3]);
    VCPLXMULCONJ(r3,i3,e[k*6+4],e[k*6+5]);

    VTRANSPOSE4(r0,r1,r2,r3);
    VTRANSPOSE4(i0,i1,i2,i3);

    *out++ = r0; *out++ = i0; *out++ = r1; *out++ = i1;
    *out++ = r2; *out++ = i2; *out++ = r3; *out++ = i3;
  }
}